

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O3

int squall::detail::
    Stub<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>::
    doit<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>>
              (HSQUIRRELVM vm,SQInteger index,
              function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *f)

{
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this;
  int iVar1;
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  newf;
  _Any_data local_c0;
  code *local_b0;
  _Any_data local_a0;
  code *local_90;
  undefined8 uStack_88;
  partial_application<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_&,_std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_80;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_58;
  _Any_data local_50;
  code *local_40;
  undefined8 local_38;
  
  Fetch<std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_(squall::detail::FetchContext)0>
  ::doit((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)&local_c0,vm,index);
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_a0,
             (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_c0);
  local_50._M_unused._M_object = (void *)0x0;
  local_50._8_8_ = 0;
  local_40 = (code *)0x0;
  local_38 = uStack_88;
  if (local_90 != (code *)0x0) {
    local_50._M_unused._M_object = local_a0._M_unused._M_object;
    local_50._8_8_ = local_a0._8_8_;
    local_40 = local_90;
    local_90 = (code *)0x0;
    uStack_88 = 0;
  }
  local_58 = f;
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  this = &local_80.arg;
  local_80.f = f;
  std::
  function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this,(function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&local_50);
  iVar1 = Stub<void(std::__cxx11::string_const&)>::
          doit<squall::detail::partial_application<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>&,std::function<int(std::__cxx11::string_const&)>>>
                    (vm,index + 1,&local_80);
  if (local_80.arg.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.arg.super__Function_base._M_manager)
              ((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return iVar1;
}

Assistant:

static int doit(HSQUIRRELVM vm, SQInteger index, F f) {
        auto newf =
            partial(
                f,
                unwrap_type(
                    fetch<H, detail::FetchContext::Argument>(vm, index)));
        return Stub<R (T...)>::doit(vm, index+1, newf);
    }